

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

void device3(void *arg)

{
  int line;
  int iVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  int sock;
  
  line = test_socket_impl((char *)0x58,2,0x70,in_ECX);
  test_bind_impl((char *)0x59,line,0x102217,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar1 = nn_device(line,0xffffffff);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x60,line,sock);
      return;
    }
  }
  device3_cold_1();
}

Assistant:

void device3 (NN_UNUSED void *arg)
{
    int rc;
    int deve;

    /*  Intialise the device socket. */
    deve = test_socket (AF_SP_RAW, NN_BUS);
    test_bind (deve, SOCKET_ADDRESS_E);

    /*  Run the device. */
    rc = nn_device (deve, -1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (deve);
}